

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68k-dis.c
# Opt level: O1

int fetch_data(disassemble_info *info,bfd_byte *addr)

{
  undefined8 *puVar1;
  int iVar2;
  bfd_vma bVar3;
  
  puVar1 = (undefined8 *)info->private_data;
  iVar2 = (int)(bfd_byte *)*puVar1;
  bVar3 = ((iVar2 - (int)puVar1) + *(int *)(puVar1 + 4)) - 8;
  iVar2 = (*info->read_memory_func)(bVar3,(bfd_byte *)*puVar1,(int)addr - iVar2,info);
  if (iVar2 == 0) {
    *puVar1 = addr;
  }
  else {
    (*info->memory_error_func)(iVar2,bVar3,info);
  }
  return (uint)(iVar2 == 0);
}

Assistant:

static int
fetch_data (struct disassemble_info *info, bfd_byte *addr)
{
  int status;
  struct private *priv = (struct private *)info->private_data;
  bfd_vma start = priv->insn_start + (priv->max_fetched - priv->the_buffer);

  status = (*info->read_memory_func) (start,
				      priv->max_fetched,
				      addr - priv->max_fetched,
				      info);
  if (status != 0)
    {
      (*info->memory_error_func) (status, start, info);
      return 0;
    }
  else
    priv->max_fetched = addr;
  return 1;
}